

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

Point3f __thiscall pbrt::ShapeSampleContext::OffsetRayOrigin(ShapeSampleContext *this,Vector3f w)

{
  undefined8 uVar1;
  Normal3<float> n;
  Tuple3<pbrt::Normal3,_float> t;
  Vector3<float> v;
  Point3<pbrt::Interval> p;
  Normal3<float> n_00;
  Tuple3<pbrt::Vector3,_float> t_00;
  Vector3<float> v_00;
  Tuple3<pbrt::Point3,_float> TVar2;
  float *pfVar3;
  long in_RDI;
  type tVar4;
  type tVar5;
  float fVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Normal3<float> NVar13;
  Vector3f VVar14;
  Vector3<float> VVar15;
  Point3<float> PVar16;
  int i;
  Vector3f offset;
  Float d;
  Point3f po;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffde0;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 uVar20;
  float in_stack_fffffffffffffe10;
  Float in_stack_fffffffffffffe14;
  int local_1dc;
  Tuple3<pbrt::Vector3,_float> local_c0;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  float local_38;
  type local_34;
  undefined8 local_28;
  undefined8 local_18;
  Tuple3<pbrt::Point3,_float> local_c;
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  
  local_28 = vmovlpd_avx(in_ZMM0._0_16_);
  fVar6 = (float)in_RDI;
  uVar20 = (undefined4)((ulong)in_RDI >> 0x20);
  local_58 = *(undefined4 *)(in_RDI + 0x20);
  local_60 = *(undefined8 *)(in_RDI + 0x18);
  auVar12 = ZEXT856(0);
  t.y = (float)in_stack_fffffffffffffe04;
  t.x = (float)in_stack_fffffffffffffe00;
  t.z = fVar6;
  local_50 = local_60;
  local_48 = local_58;
  local_18 = local_28;
  NVar13 = Abs<pbrt::Normal3,float>(t);
  local_68 = NVar13.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar7._0_8_ = NVar13.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar7._8_56_ = auVar12;
  local_70 = vmovlpd_avx(auVar7._0_16_);
  local_40 = local_70;
  local_38 = local_68;
  VVar14 = Point3fi::Error((Point3fi *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)
                          );
  local_a8 = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar12;
  local_b0 = vmovlpd_avx(auVar8._0_16_);
  local_98 = local_38;
  local_a0 = local_40;
  n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar20;
  n_00.super_Tuple3<pbrt::Normal3,_float>.x = fVar6;
  n_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffe10;
  VVar15.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffdf0;
  VVar15.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffdec;
  VVar15.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffdf4;
  local_90 = local_b0;
  local_88 = local_a8;
  local_80 = local_b0;
  local_78 = local_a8;
  tVar4 = Dot<float>(n_00,VVar15);
  NVar13.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffdf0;
  NVar13.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffdec;
  NVar13.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffdf4;
  local_34 = tVar4;
  Vector3<float>::Vector3<float>((Vector3<float> *)0x5a4246,NVar13);
  auVar12 = (undefined1  [56])0x0;
  t_00.y = (float)uVar20;
  t_00.x = fVar6;
  t_00.z = in_stack_fffffffffffffe10;
  VVar15 = pbrt::operator*(in_stack_fffffffffffffdf4,t_00);
  local_c0.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar12;
  local_c0._0_8_ = vmovlpd_avx(auVar9._0_16_);
  v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar20;
  v_00.super_Tuple3<pbrt::Vector3,_float>.x = fVar6;
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe10;
  n.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffdf0;
  n.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffdec;
  n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffdf4;
  tVar5 = Dot<float>(v_00,n);
  auVar12 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  if (tVar5 < 0.0) {
    VVar15 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffde0);
    local_c0.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar12;
    local_c0._0_8_ = vmovlpd_avx(auVar10._0_16_);
  }
  uVar1 = *(undefined8 *)(CONCAT44(uVar20,fVar6) + 0x10);
  uVar17 = *(undefined8 *)(CONCAT44(uVar20,fVar6) + 8);
  uVar18 = (undefined4)uVar1;
  uVar19 = (undefined4)((ulong)uVar1 >> 0x20);
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = tVar4;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)in_stack_fffffffffffffe00;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = fVar6;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)uVar20;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = in_stack_fffffffffffffe10;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = in_stack_fffffffffffffe14;
  Point3<float>::Point3<pbrt::Interval>
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),p);
  auVar12 = ZEXT856(0);
  v.super_Tuple3<pbrt::Vector3,_float>.y = tVar4;
  v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe00;
  v.super_Tuple3<pbrt::Vector3,_float>.z = fVar6;
  PVar16 = Point3<float>::operator+((Point3<float> *)CONCAT44(uVar19,uVar18),v);
  local_c.z = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar12;
  local_c._0_8_ = vmovlpd_avx(auVar11._0_16_);
  for (local_1dc = 0; local_1dc < 3; local_1dc = local_1dc + 1) {
    pfVar3 = Tuple3<pbrt::Vector3,_float>::operator[](&local_c0,local_1dc);
    if (*pfVar3 <= 0.0) {
      pfVar3 = Tuple3<pbrt::Vector3,_float>::operator[](&local_c0,local_1dc);
      if (*pfVar3 < 0.0) {
        Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_1dc);
        fVar6 = NextFloatDown((float)uVar17);
        pfVar3 = Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_1dc);
        *pfVar3 = fVar6;
      }
    }
    else {
      Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_1dc);
      fVar6 = NextFloatUp((float)uVar17);
      pfVar3 = Tuple3<pbrt::Point3,_float>::operator[](&local_c,local_1dc);
      *pfVar3 = fVar6;
    }
  }
  TVar2.z = local_c.z;
  TVar2.x = local_c.x;
  TVar2.y = local_c.y;
  return (Point3f)TVar2;
}

Assistant:

PBRT_CPU_GPU inline Point3f ShapeSampleContext::OffsetRayOrigin(Vector3f w) const {
    // Find vector _offset_ to corner of error bounds and compute initial _po_
    Float d = Dot(Abs(n), pi.Error());
    Vector3f offset = d * Vector3f(n);
    if (Dot(w, n) < 0)
        offset = -offset;
    Point3f po = Point3f(pi) + offset;

    // Round offset point _po_ away from _p_
    for (int i = 0; i < 3; ++i) {
        if (offset[i] > 0)
            po[i] = NextFloatUp(po[i]);
        else if (offset[i] < 0)
            po[i] = NextFloatDown(po[i]);
    }

    return po;
}